

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

bool __thiscall
ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>::has_label_value
          (basic_dynamic_counter<double,_(unsigned_char)__x02_> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *label_value)

{
  undefined1 *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  undefined8 auStack_88 [2];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> arr;
  undefined1 local_30 [16];
  
  arr._M_elems[1].field_2._M_allocated_capacity = 0;
  arr._M_elems[1].field_2._8_8_ = 0;
  arr._M_elems[1]._M_dataplus._M_p = (pointer)0x0;
  arr._M_elems[1]._M_string_length = 0;
  arr._M_elems[0].field_2._M_allocated_capacity = 0;
  arr._M_elems[0].field_2._8_8_ = 0;
  arr._M_elems[0]._M_dataplus._M_p = (pointer)0x0;
  arr._M_elems[0]._M_string_length = 0;
  lVar2 = 0x10;
  do {
    puVar1 = (undefined1 *)((long)&arr._M_elems[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)auStack_88 + lVar2) = puVar1;
    *(undefined8 *)((long)arr._M_elems + lVar2 + -8) = 0;
    *puVar1 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x50);
  uVar3 = (long)(label_value->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(label_value->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar4 = 2;
  if (uVar3 < 2) {
    uVar4 = uVar3;
  }
  if (uVar3 < 3) {
    for (lVar2 = 0; uVar4 * 0x20 != lVar2; lVar2 = lVar2 + 0x20) {
      auStack_88[1] = 0x179d00;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&arr._M_elems[0]._M_dataplus._M_p + lVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(((label_value->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
    }
    auStack_88[1] = 0x179d16;
    dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::find
              ((dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_> *)local_30,
               (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                )this);
    bVar5 = (_func_int **)local_30._0_8_ != (_func_int **)0x0;
    auStack_88[1] = 0x179d28;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  }
  else {
    bVar5 = false;
  }
  auStack_88[1] = 0x179d30;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array(&arr);
  return bVar5;
}

Assistant:

bool has_label_value(const std::vector<std::string> &label_value) override {
    std::array<std::string, N> arr{};
    size_t size = (std::min)((size_t)N, label_value.size());
    if (label_value.size() > N) {
      return false;
    }

    for (size_t i = 0; i < size; i++) {
      arr[i] = label_value[i];
    }
    return Base::find(arr) != nullptr;
  }